

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_privkey_tweak_neg(secp256k1_context *ctx,uchar *seckey)

{
  int iVar1;
  int overflow;
  int local_5c;
  secp256k1_scalar local_58;
  secp256k1_scalar local_38;
  
  local_5c = 0;
  secp256k1_scalar_set_b32(&local_58,seckey,&local_5c);
  iVar1 = local_5c;
  seckey[0x10] = '\0';
  seckey[0x11] = '\0';
  seckey[0x12] = '\0';
  seckey[0x13] = '\0';
  seckey[0x14] = '\0';
  seckey[0x15] = '\0';
  seckey[0x16] = '\0';
  seckey[0x17] = '\0';
  seckey[0x18] = '\0';
  seckey[0x19] = '\0';
  seckey[0x1a] = '\0';
  seckey[0x1b] = '\0';
  seckey[0x1c] = '\0';
  seckey[0x1d] = '\0';
  seckey[0x1e] = '\0';
  seckey[0x1f] = '\0';
  seckey[0] = '\0';
  seckey[1] = '\0';
  seckey[2] = '\0';
  seckey[3] = '\0';
  seckey[4] = '\0';
  seckey[5] = '\0';
  seckey[6] = '\0';
  seckey[7] = '\0';
  seckey[8] = '\0';
  seckey[9] = '\0';
  seckey[10] = '\0';
  seckey[0xb] = '\0';
  seckey[0xc] = '\0';
  seckey[0xd] = '\0';
  seckey[0xe] = '\0';
  seckey[0xf] = '\0';
  if (local_5c == 0) {
    secp256k1_scalar_negate(&local_38,&local_58);
    secp256k1_scalar_get_b32(seckey,&local_38);
  }
  return (int)(iVar1 == 0);
}

Assistant:

int secp256k1_ec_privkey_tweak_neg(const secp256k1_context* ctx, unsigned char *seckey) {
    secp256k1_scalar sec;
    secp256k1_scalar neg;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    secp256k1_scalar_set_b32(&sec, seckey, &overflow);
    ret = !overflow;
    memset(seckey, 0, 32);
    if (ret) {
        secp256k1_scalar_negate(&neg, &sec);
        secp256k1_scalar_get_b32(seckey, &neg);
        secp256k1_scalar_clear(&neg);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}